

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintRawArrayTo<nsh_cmd>(nsh_cmd *a,size_t count,ostream *os)

{
  size_t local_28;
  size_t i;
  ostream *os_local;
  size_t count_local;
  nsh_cmd *a_local;
  
  UniversalPrint<nsh_cmd>(a,os);
  for (local_28 = 1; local_28 != count; local_28 = local_28 + 1) {
    std::operator<<(os,", ");
    UniversalPrint<nsh_cmd>(a + local_28,os);
  }
  return;
}

Assistant:

void PrintRawArrayTo(const T a[], size_t count, ::std::ostream* os) {
  UniversalPrint(a[0], os);
  for (size_t i = 1; i != count; i++) {
    *os << ", ";
    UniversalPrint(a[i], os);
  }
}